

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *allocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *in_FS_OFFSET;
  uint maxPageCount;
  bool enableWriteBarrier_local;
  bool allocated_local;
  bool committed_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *allocator_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  SegmentBase<Memory::PreReservedVirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  BVStatic<272UL>::BVStatic(&this->freePages);
  BVStatic<272UL>::BVStatic(&this->decommitPages);
  this->decommitPageCount = 0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c =
       (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c & 0xfb | 4;
  if ((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount !=
      (ulong)(allocator->maxAllocPageCount + allocator->secondaryAllocPageCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xe0,
                       "(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount)"
                       ,
                       "this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar3 = GetMaxPageCount(this);
  if (committed) {
    if (allocated) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xe6,"(!allocated)","!allocated");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    uVar4 = GetAvailablePageCount(this);
    this->freePageCount = uVar4;
    SetRangeInFreePagesBitVector(this,0,this->freePageCount);
    if (this->freePageCount != uVar3) {
      ClearRangeInFreePagesBitVector(this,this->freePageCount,uVar3 - this->freePageCount);
    }
    uVar3 = GetCountOfFreePages(this);
    if (uVar3 != this->freePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xee,"(this->GetCountOfFreePages() == this->freePageCount)",
                         "this->GetCountOfFreePages() == this->freePageCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    this->freePageCount = 0;
    ClearAllInFreePagesBitVector(this);
    if (!allocated) {
      uVar4 = GetAvailablePageCount(this);
      this->decommitPageCount = uVar4;
      SetRangeInDecommitPagesBitVector(this,0,this->decommitPageCount);
      if (this->decommitPageCount != uVar3) {
        ClearRangeInDecommitPagesBitVector
                  (this,this->decommitPageCount,uVar3 - this->decommitPageCount);
      }
    }
  }
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, bool committed, bool allocated, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    Assert(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount);

    uint maxPageCount = GetMaxPageCount();

    if (committed)
    {
        Assert(!allocated);
        this->freePageCount = this->GetAvailablePageCount();
        this->SetRangeInFreePagesBitVector(0, this->freePageCount);
        if (this->freePageCount != maxPageCount)
        {
            this->ClearRangeInFreePagesBitVector(this->freePageCount, (maxPageCount - this->freePageCount));
        }

        Assert(this->GetCountOfFreePages() == this->freePageCount);
    }
    else
    {
        this->freePageCount = 0;
        this->ClearAllInFreePagesBitVector();
        if (!allocated)
        {
            this->decommitPageCount = this->GetAvailablePageCount();
            this->SetRangeInDecommitPagesBitVector(0, this->decommitPageCount);

            if (this->decommitPageCount != maxPageCount)
            {
                this->ClearRangeInDecommitPagesBitVector(this->decommitPageCount, (maxPageCount - this->decommitPageCount));
            }
        }
    }
}